

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_115e484::ActivityObserver::set_led_status
          (ActivityObserver *this,string *name,bool lit)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock_guard;
  bool lit_local;
  string *name_local;
  ActivityObserver *this_local;
  
  lock_guard._M_device._7_1_ = lit;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mutex);
  if ((lock_guard._M_device._7_1_ & 1) == 0) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&this->lit_leds_,name);
  }
  else {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->lit_leds_,name);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void set_led_status(const std::string &name, bool lit) final {
			std::lock_guard lock_guard(mutex);
			if(lit) lit_leds_.insert(name);
			else lit_leds_.erase(name);
		}